

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.cpp
# Opt level: O0

void helics::loadTags(value *section,
                     function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                     *tagAction)

{
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __args_1_00;
  basic_string_view<char,_std::char_traits<char>_> __args_1_01;
  basic_string_view<char,_std::char_traits<char>_> __args;
  basic_string_view<char,_std::char_traits<char>_> __args_00;
  basic_string_view<char,_std::char_traits<char>_> __args_01;
  bool bVar1;
  value_type *this;
  char *pcVar2;
  table_type *ptVar3;
  basic_value<toml::type_config> *in_RSI;
  char *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>
  *values;
  iterator __end5;
  iterator __begin5;
  table_type *__range5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tagPair_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tagPair;
  size_t ii;
  value_type tagValue;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
  *in_stack_fffffffffffffd38;
  basic_value<toml::type_config> *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd50;
  size_t in_stack_fffffffffffffd58;
  basic_value<toml::type_config> *pbVar4;
  char *in_stack_fffffffffffffd60;
  char *pcVar5;
  basic_value<toml::type_config> *in_stack_fffffffffffffd68;
  allocator<char> *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  key_type *k;
  basic_value<toml::type_config> *in_stack_fffffffffffffda0;
  key_type *local_240;
  basic_value<toml::type_config> *in_stack_fffffffffffffdd0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_218;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>
  local_210;
  table_type *local_208;
  __sv_type local_200;
  __sv_type local_1f0;
  basic_value<toml::type_config> *in_stack_fffffffffffffe38;
  char *local_140;
  allocator<char> local_131 [9];
  undefined8 in_stack_fffffffffffffed8;
  key_type local_31;
  basic_value<toml::type_config> *local_10;
  char *local_8;
  
  k = &local_31;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  bVar1 = toml::basic_value<toml::type_config>::contains(in_stack_fffffffffffffda0,k);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd40);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (bVar1) {
    pbVar4 = (basic_value<toml::type_config> *)local_131;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar4,local_8,
               in_stack_fffffffffffffd70);
    this = toml::basic_value<toml::type_config>::at(in_stack_fffffffffffffdd0,local_240);
    toml::basic_value<toml::type_config>::basic_value(this,in_stack_fffffffffffffd68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd40);
    std::allocator<char>::~allocator(local_131);
    bVar1 = toml::basic_value<toml::type_config>::is_array
                      ((basic_value<toml::type_config> *)0x77a75e);
    if (bVar1) {
      local_140 = (char *)0x0;
      while (pcVar5 = local_140,
            pcVar2 = (char *)toml::basic_value<toml::type_config>::size
                                       ((basic_value<toml::type_config> *)in_stack_fffffffffffffed8)
            , pcVar5 < pcVar2) {
        toml::basic_value<toml::type_config>::operator[]
                  (in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38);
        getTagPair<toml::basic_value<toml::type_config>>(in_stack_fffffffffffffe38);
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x77a7db)
        ;
        if (!bVar1) {
          pbVar4 = local_10;
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd40);
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd40);
          __args._M_str = pcVar5;
          __args._M_len = (size_t)pbVar4;
          __args_1._M_str = in_stack_fffffffffffffd50;
          __args_1._M_len = in_stack_fffffffffffffd48;
          std::
          function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)in_stack_fffffffffffffd40,__args,__args_1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffd40);
        local_140 = local_140 + 1;
      }
    }
    else {
      getTagPair<toml::basic_value<toml::type_config>>(in_stack_fffffffffffffe38);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x77a97b);
      if (bVar1) {
        bVar1 = toml::basic_value<toml::type_config>::is_table
                          ((basic_value<toml::type_config> *)0x77aa21);
        if (bVar1) {
          ptVar3 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_(pbVar4);
          local_208 = ptVar3;
          local_210._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
               ::begin(in_stack_fffffffffffffd38);
          local_218._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
               ::end(in_stack_fffffffffffffd38);
          while (bVar1 = std::__detail::operator==(&local_210,&local_218),
                ((bVar1 ^ 0xffU) & 1) != 0) {
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
            ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                         *)0x77aaa2);
            in_stack_fffffffffffffd40 = local_10;
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10
                      );
            fileops::tomlAsString_abi_cxx11_((value *)in_stack_fffffffffffffed8);
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd40);
            __args_01._M_str = in_stack_fffffffffffffd60;
            __args_01._M_len = in_stack_fffffffffffffd58;
            __args_1_01._M_str = in_stack_fffffffffffffd50;
            __args_1_01._M_len = (size_t)ptVar3;
            std::
            function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)in_stack_fffffffffffffd40,__args_01,__args_1_01);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd40);
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
            ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_false,_true>
                          *)in_stack_fffffffffffffd40);
          }
        }
      }
      else {
        local_1f0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffd40);
        local_200 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffd40);
        __args_00._M_str = in_stack_fffffffffffffd60;
        __args_00._M_len = in_stack_fffffffffffffd58;
        __args_1_00._M_str = (char *)local_10;
        __args_1_00._M_len = in_stack_fffffffffffffd48;
        std::
        function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)in_stack_fffffffffffffd40,__args_00,__args_1_00);
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffd40);
    }
    toml::basic_value<toml::type_config>::~basic_value(in_stack_fffffffffffffd40);
  }
  return;
}

Assistant:

void loadTags(const toml::value& section,
              const std::function<void(std::string_view, std::string_view)>& tagAction)
{
    if (section.contains("tags")) {
        auto tagValue = section.at("tags");
        if (tagValue.is_array()) {
            for (std::size_t ii = 0; ii < tagValue.size(); ++ii) {
                auto tagPair = getTagPair(tagValue[ii]);
                if (!tagPair.first.empty()) {
                    tagAction(tagPair.first, tagPair.second);
                }
            }
        } else {
            auto tagPair = getTagPair(tagValue);
            if (!tagPair.first.empty()) {
                tagAction(tagPair.first, tagPair.second);
            } else if (tagValue.is_table()) {
                for (auto& values : tagValue.as_table()) {
                    tagAction(values.first, fileops::tomlAsString(values.second));
                }
            }
        }
    }
}